

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O2

uint __thiscall Assimp::XGLImporter::ReadIDAttr(XGLImporter *this)

{
  element_type *peVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  uint uVar4;
  
  uVar2 = (*((this->m_reader).
             super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_IIrrXMLReader[4])();
  uVar4 = 0;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  while( true ) {
    if (uVar2 == uVar4) {
      return 0xffffffff;
    }
    peVar1 = (this->m_reader).
             super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    iVar3 = (*peVar1->_vptr_IIrrXMLReader[5])(peVar1,(ulong)uVar4);
    iVar3 = ASSIMP_stricmp((char *)CONCAT44(extraout_var,iVar3),"id");
    if (iVar3 == 0) break;
    uVar4 = uVar4 + 1;
  }
  peVar1 = (this->m_reader).
           super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar2 = (*peVar1->_vptr_IIrrXMLReader[10])(peVar1,(ulong)uVar4);
  return uVar2;
}

Assistant:

unsigned int XGLImporter::ReadIDAttr()
{
    for(int i = 0, e = m_reader->getAttributeCount(); i < e; ++i) {

        if(!ASSIMP_stricmp(m_reader->getAttributeName(i),"id")) {
            return m_reader->getAttributeValueAsInt(i);
        }
    }
    return ~0u;
}